

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

RGB __thiscall pbrt::MIPMap::Filter<pbrt::RGB>(MIPMap *this,Point2f st,Vector2f dst0,Vector2f dst1)

{
  FilterFunction FVar1;
  undefined8 uVar2;
  size_t sVar3;
  bool bVar4;
  uint uVar5;
  float *__result;
  float *pfVar6;
  Point2i PVar7;
  long lVar8;
  undefined4 extraout_var;
  Tuple2<pbrt::Point2,_int> st_00;
  int level;
  uint level_00;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined8 uVar13;
  undefined8 in_XMM0_Qb;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar24 [64];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar28 [12];
  undefined1 auVar27 [16];
  undefined1 in_ZMM3 [64];
  Tuple2<pbrt::Vector2,_float> dst1_00;
  undefined1 auVar29 [16];
  undefined1 in_register_00001384 [12];
  RGB RVar30;
  RGB RVar31;
  int vb;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  Float va;
  float afStack_44 [3];
  undefined8 local_38;
  undefined1 local_28 [16];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar28 = in_ZMM3._4_12_;
  auVar24._8_56_ = in_register_00001288;
  auVar24._0_8_ = dst1.super_Tuple2<pbrt::Vector2,_float>;
  auVar22._8_56_ = in_register_00001248;
  auVar22._0_8_ = dst0.super_Tuple2<pbrt::Vector2,_float>;
  auVar10 = auVar22._0_16_;
  auVar16 = auVar24._0_16_;
  if ((this->options).filter == EWA) {
    auVar14._0_4_ =
         dst0.super_Tuple2<pbrt::Vector2,_float>.x * dst0.super_Tuple2<pbrt::Vector2,_float>.x;
    auVar14._4_4_ =
         dst0.super_Tuple2<pbrt::Vector2,_float>.y * dst0.super_Tuple2<pbrt::Vector2,_float>.y;
    auVar14._8_4_ = in_register_00001248._0_4_ * in_register_00001248._0_4_;
    auVar14._12_4_ = in_register_00001248._4_4_ * in_register_00001248._4_4_;
    auVar11 = vhaddps_avx(auVar14,auVar14);
    auVar26._0_4_ =
         dst1.super_Tuple2<pbrt::Vector2,_float>.x * dst1.super_Tuple2<pbrt::Vector2,_float>.x;
    auVar26._4_4_ =
         dst1.super_Tuple2<pbrt::Vector2,_float>.y * dst1.super_Tuple2<pbrt::Vector2,_float>.y;
    auVar26._8_4_ = in_register_00001288._0_4_ * in_register_00001288._0_4_;
    auVar26._12_4_ = in_register_00001288._4_4_ * in_register_00001288._4_4_;
    auVar23 = vhaddps_avx(auVar26,auVar26);
    auVar27 = auVar10;
    if (auVar23._0_4_ <= auVar11._0_4_) {
      auVar27 = auVar16;
      auVar16 = auVar10;
    }
    dst1_00 = auVar27._0_8_;
    auVar15._0_4_ = auVar16._0_4_ * auVar16._0_4_;
    auVar15._4_4_ = auVar16._4_4_ * auVar16._4_4_;
    auVar15._8_4_ = auVar16._8_4_ * auVar16._8_4_;
    auVar15._12_4_ = auVar16._12_4_ * auVar16._12_4_;
    auVar10 = vhaddps_avx(auVar15,auVar15);
    _local_58 = auVar16;
    if (auVar10._0_4_ < 0.0) {
      auVar18._0_4_ = sqrtf(auVar10._0_4_);
      auVar18._4_60_ = extraout_var_00;
      auVar16 = auVar18._0_16_;
    }
    else {
      auVar16 = vsqrtss_avx(auVar10,auVar10);
    }
    fVar9 = auVar27._0_4_;
    auVar17._0_4_ = fVar9 * fVar9;
    fVar20 = auVar27._4_4_;
    auVar17._4_4_ = fVar20 * fVar20;
    auVar17._8_4_ = auVar27._8_4_ * auVar27._8_4_;
    auVar17._12_4_ = auVar27._12_4_ * auVar27._12_4_;
    auVar10 = vhaddps_avx(auVar17,auVar17);
    if (auVar10._0_4_ < 0.0) {
      auVar19._0_4_ = sqrtf(auVar10._0_4_);
      auVar19._4_60_ = extraout_var_01;
      auVar10 = auVar19._0_16_;
    }
    else {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
    }
    fVar12 = auVar10._0_4_;
    fVar25 = fVar12 * (this->options).maxAnisotropy;
    uVar13 = vcmpps_avx512vl(ZEXT816(0) << 0x40,auVar10,1);
    uVar2 = vcmpps_avx512vl(ZEXT416((uint)fVar25),auVar16,1);
    bVar4 = (bool)((byte)uVar13 & (byte)uVar2 & 1);
    fVar25 = auVar16._0_4_ / fVar25;
    if (bVar4 != false) {
      dst1_00.x = fVar9 * fVar25;
      dst1_00.y = fVar20 * fVar25;
    }
    fVar9 = (float)((uint)bVar4 * (int)(fVar12 * fVar25) + (uint)!bVar4 * (int)fVar12);
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      sVar3 = (this->pyramid).nStored;
      fVar9 = logf(fVar9);
      auVar10 = vmaxss_avx(ZEXT416((uint)(fVar9 * 1.442695 + (float)((int)sVar3 + -1))),
                           ZEXT816(0) << 0x40);
      auVar16 = vroundss_avx(auVar10,auVar10,9);
      level = (int)auVar16._0_4_;
      auVar21._0_4_ = (int)auVar16._0_4_;
      auVar21._4_4_ = (int)auVar16._4_4_;
      auVar21._8_4_ = (int)auVar16._8_4_;
      auVar21._12_4_ = (int)auVar16._12_4_;
      auVar16 = vcvtdq2ps_avx(auVar21);
      fVar9 = auVar10._0_4_ - auVar16._0_4_;
      local_28 = ZEXT416((uint)fVar9);
      fVar9 = 1.0 - fVar9;
      RVar30 = EWA<pbrt::RGB>(this,level,st,(Vector2f)local_58,(Vector2f)dst1_00);
      local_38 = RVar30._0_8_;
      RVar31 = EWA<pbrt::RGB>(this,level + 1,st,(Vector2f)local_58,(Vector2f)dst1_00);
      fVar20 = RVar31.b * (float)local_28._0_4_ + RVar30.b * fVar9;
      uVar13 = CONCAT44(RVar31.g * (float)local_28._0_4_ + fVar9 * local_38._4_4_,
                        RVar31.r * (float)local_28._0_4_ + fVar9 * (float)local_38);
LAB_0034082f:
      RVar30.b = fVar20;
      RVar30.r = (Float)(int)uVar13;
      RVar30.g = (Float)(int)((ulong)uVar13 >> 0x20);
      return RVar30;
    }
  }
  else {
    auVar16 = vmovlhps_avx(auVar10,auVar16);
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    _va = vandps_avx512vl(auVar16,auVar10);
    pfVar6 = &va;
    lVar8 = 4;
    do {
      if (*pfVar6 < *(float *)((long)afStack_44 + lVar8 + -4)) {
        pfVar6 = (float *)((long)afStack_44 + lVar8 + -4);
      }
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x10);
    sVar3 = (this->pyramid).nStored;
    auVar16 = vmaxss_avx(SUB6416(ZEXT464(0x322bcc77),0),ZEXT416((uint)(*pfVar6 + *pfVar6)));
    fVar9 = logf(auVar16._0_4_);
    fVar9 = fVar9 * 1.442695 + (float)((int)sVar3 + -1);
    level_00 = (int)(this->pyramid).nStored - 1;
    if ((float)(int)level_00 <= fVar9) {
      st_00.x = 0;
      st_00.y = 0;
LAB_00340610:
      RVar30 = Texel<pbrt::RGB>(this,level_00,(Point2i)st_00);
      return RVar30;
    }
    auVar16 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
    uVar5 = (uint)auVar16._0_4_;
    level_00 = ~((int)uVar5 >> 0x1f) & uVar5;
    FVar1 = (this->options).filter;
    if (FVar1 != Trilinear) {
      if (FVar1 != Bilinear) {
        if (FVar1 != Point) {
          LogFatal<char_const(&)[44]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
                     ,0xf9,"Check failed: %s",
                     (char (*) [44])"options.filter == FilterFunction::Trilinear");
        }
        PVar7 = LevelResolution(this,level_00);
        auVar16._0_4_ = (float)PVar7.super_Tuple2<pbrt::Point2,_int>.x;
        auVar16._4_12_ = auVar28;
        auVar11._8_8_ = in_XMM0_Qb;
        auVar11._0_8_ = st.super_Tuple2<pbrt::Point2,_float>;
        auVar16 = vfmadd213ss_fma(auVar16,auVar11,SUB6416(ZEXT464(0xbf000000),0));
        auVar23._8_4_ = 0x80000000;
        auVar23._0_8_ = 0x8000000080000000;
        auVar23._12_4_ = 0x80000000;
        auVar27._8_4_ = 0x3effffff;
        auVar27._0_8_ = 0x3effffff3effffff;
        auVar27._12_4_ = 0x3effffff;
        auVar10 = vpternlogd_avx512vl(auVar27,auVar16,auVar23,0xf8);
        auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar10._0_4_));
        auVar10 = vroundss_avx(auVar16,auVar16,0xb);
        auVar16 = vmovshdup_avx(auVar11);
        auVar29._0_4_ = (float)PVar7.super_Tuple2<pbrt::Point2,_int>.y;
        auVar29._4_12_ = in_register_00001384;
        auVar16 = vfmadd213ss_fma(auVar29,auVar16,SUB6416(ZEXT464(0xbf000000),0));
        auVar11 = vpternlogd_avx512vl(auVar27,auVar16,auVar23,0xf8);
        auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar11._0_4_));
        auVar16 = vroundss_avx(auVar16,auVar16,0xb);
        st_00 = (Tuple2<pbrt::Point2,_int>)
                (CONCAT44(extraout_var,(int)auVar10._0_4_) | (ulong)(uint)(int)auVar16._0_4_ << 0x20
                );
        goto LAB_00340610;
      }
      goto LAB_003406a1;
    }
    if (0 < (int)uVar5) {
      fVar9 = fVar9 - (float)(int)level_00;
      va = fVar9;
      vb = 1;
      if (1.0 < fVar9) {
        LogFatal<char_const(&)[6],char_const(&)[2],char_const(&)[6],float&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
                   ,0xfe,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [6])0x2c8fa0f,
                   (char (*) [2])0x2c93cbe,(char (*) [6])0x2c8fa0f,&va,(char (*) [2])0x2c93cbe,&vb);
      }
      RVar30 = Bilerp<pbrt::RGB>(this,level_00,st);
      uStack_50 = in_XMM0_Qb;
      local_58 = (undefined1  [8])RVar30._0_8_;
      RVar31 = Bilerp<pbrt::RGB>(this,level_00 + 1,st);
      fVar25 = 1.0 - fVar9;
      fVar20 = fVar25 * RVar30.b + fVar9 * RVar31.b;
      uVar13 = CONCAT44(fVar25 * (float)local_58._4_4_ + fVar9 * RVar31.g,
                        fVar25 * (float)local_58._0_4_ + fVar9 * RVar31.r);
      goto LAB_0034082f;
    }
  }
  level_00 = 0;
LAB_003406a1:
  RVar30 = Bilerp<pbrt::RGB>(this,level_00,st);
  return RVar30;
}

Assistant:

T MIPMap::Filter(Point2f st, Vector2f dst0, Vector2f dst1) const {
    if (options.filter != FilterFunction::EWA) {
        // Handle non-EWA MIP Map filter
        Float width = 2 * std::max({std::abs(dst0[0]), std::abs(dst0[1]),
                                    std::abs(dst1[0]), std::abs(dst1[1])});
        // Compute MIP Map level for _width_ and handle very wide filter
        int nLevels = Levels();
        Float level = nLevels - 1 + Log2(std::max<Float>(width, 1e-8));
        if (level >= Levels() - 1)
            return Texel<T>(Levels() - 1, {0, 0});
        int iLevel = std::max(0, int(std::floor(level)));

        if (options.filter == FilterFunction::Point) {
            // Return point-sampled value at selected MIP level
            Point2i resolution = LevelResolution(iLevel);
            Point2i sti(std::round(st[0] * resolution[0] - 0.5f),
                        std::round(st[1] * resolution[1] - 0.5f));
            return Texel<T>(iLevel, sti);

        } else if (options.filter == FilterFunction::Bilinear) {
            // Return bilinear-filtered value at selected MIP level
            return Bilerp<T>(iLevel, st);

        } else {
            // Return trilinear-filtered value at selected MIP level
            CHECK(options.filter == FilterFunction::Trilinear);
            if (iLevel == 0)
                return Bilerp<T>(0, st);
            else {
                Float delta = level - iLevel;
                CHECK_LE(delta, 1);
                return Lerp(delta, Bilerp<T>(iLevel, st), Bilerp<T>(iLevel + 1, st));
            }
        }
    }
    // Compute ellipse minor and major axes
    if (LengthSquared(dst0) < LengthSquared(dst1))
        pstd::swap(dst0, dst1);
    Float majorLength = Length(dst0), minorLength = Length(dst1);

    // Clamp ellipse eccentricity if too large
    if (minorLength * options.maxAnisotropy < majorLength && minorLength > 0) {
        Float scale = majorLength / (minorLength * options.maxAnisotropy);
        dst1 *= scale;
        minorLength *= scale;
    }
    if (minorLength == 0)
        return Bilerp<T>(0, st);

    // Choose level of detail for EWA lookup and perform EWA filtering
    Float lod = std::max<Float>(0, Levels() - 1 + Log2(minorLength));
    int ilod = std::floor(lod);
    return ((1 - (lod - ilod)) * EWA<T>(ilod, st, dst0, dst1) +
            (lod - ilod) * EWA<T>(ilod + 1, st, dst0, dst1));
}